

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O1

bool SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::
     $_10::__invoke(Search::search__unsigned_long_unsigned_int__float__
               (search *sch,size_t t,action *a,float *a_cost)

{
  action aVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = *(long *)((long)sch->metatask_data + 0x30);
  lVar4 = *(long *)((long)sch->metatask_data + 0x78) * 0x30;
  lVar3 = *(long *)(lVar2 + 8 + lVar4);
  if ((t < (ulong)(*(long *)(lVar2 + 0x10 + lVar4) - lVar3 >> 3)) &&
     (aVar1 = *(action *)(lVar3 + t * 8), aVar1 != 0xffffffff)) {
    *a = aVar1;
    *a_cost = *(float *)(*(long *)(lVar2 + lVar4 + 8) + 4 + t * 8);
    return true;
  }
  return false;
}

Assistant:

T* get_metatask_data()
  {
    return (T*)metatask_data;
  }